

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-value.c
# Opt level: O3

void test_uint64(void)

{
  int iVar1;
  VALUE_TYPE VVar2;
  int32_t iVar3;
  uint32_t uVar4;
  int64_t iVar5;
  uint64_t uVar6;
  uint uVar7;
  float fVar8;
  double dVar9;
  VALUE v;
  VALUE local_30;
  
  iVar1 = value_init_uint64((VALUE *)0x0,0);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x15b,"%s","value_init_uint64(NULL, 0) != 0");
  value_init_uint64(&local_30,0);
  VVar2 = value_type(&local_30);
  acutest_check_((uint)(VVar2 == VALUE_UINT64),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x15e,"%s","value_type(&v) == VALUE_UINT64");
  iVar1 = value_is_compatible(&local_30,VALUE_NULL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x15f,"%s","!value_is_compatible(&v, VALUE_NULL)");
  uVar7 = 1;
  iVar1 = value_is_compatible(&local_30,VALUE_BOOL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x160,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(&local_30,VALUE_INT32);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x161,"%s","value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(&local_30,VALUE_UINT32);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x162,"%s","value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(&local_30,VALUE_INT64);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x163,"%s","value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(&local_30,VALUE_UINT64);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x164,"%s","value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(&local_30,VALUE_FLOAT);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x165,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(&local_30,VALUE_DOUBLE);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x166,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(&local_30,VALUE_ARRAY);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x167,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(&local_30,VALUE_DICT);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x168,"%s","!value_is_compatible(&v, VALUE_DICT)");
  iVar3 = value_int32(&local_30);
  acutest_check_((uint)(iVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x169,"%s","value_int32(&v) == 0");
  uVar4 = value_uint32(&local_30);
  acutest_check_((uint)(uVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x16a,"%s","value_uint32(&v) == 0");
  iVar5 = value_int64(&local_30);
  acutest_check_((uint)(iVar5 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x16b,"%s","value_int64(&v) == 0");
  uVar6 = value_uint64(&local_30);
  acutest_check_((uint)(uVar6 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x16c,"%s","value_uint64(&v) == 0");
  fVar8 = value_float(&local_30);
  if (((0.0 < fVar8 * 0.9999) || (fVar8 * 1.0001 < 0.0)) && (uVar7 = 0, fVar8 * 1.0001 <= 0.0)) {
    uVar7 = (uint)(0.0 <= fVar8 * 0.9999);
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x16d,"%s","FLOAT_EQ(value_float(&v), 0.0f)");
  dVar9 = value_double(&local_30);
  if (((0.0 < dVar9 * 0.9999999) || (uVar7 = 1, dVar9 * 1.0000001 < 0.0)) &&
     (uVar7 = 0, dVar9 * 1.0000001 <= 0.0)) {
    uVar7 = (uint)(0.0 <= dVar9 * 0.9999999);
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x16e,"%s","DOUBLE_EQ(value_double(&v), 0.0)");
  value_fini(&local_30);
  value_init_uint64(&local_30,0xffffffffffffffff);
  VVar2 = value_type(&local_30);
  acutest_check_((uint)(VVar2 == VALUE_UINT64),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x172,"%s","value_type(&v) == VALUE_UINT64");
  iVar1 = value_is_compatible(&local_30,VALUE_NULL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x173,"%s","!value_is_compatible(&v, VALUE_NULL)");
  uVar7 = 1;
  iVar1 = value_is_compatible(&local_30,VALUE_BOOL);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x174,"%s","!value_is_compatible(&v, VALUE_BOOL)");
  iVar1 = value_is_compatible(&local_30,VALUE_INT32);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x175,"%s","!value_is_compatible(&v, VALUE_INT32)");
  iVar1 = value_is_compatible(&local_30,VALUE_UINT32);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x176,"%s","!value_is_compatible(&v, VALUE_UINT32)");
  iVar1 = value_is_compatible(&local_30,VALUE_INT64);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x177,"%s","!value_is_compatible(&v, VALUE_INT64)");
  iVar1 = value_is_compatible(&local_30,VALUE_UINT64);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x178,"%s","value_is_compatible(&v, VALUE_UINT64)");
  iVar1 = value_is_compatible(&local_30,VALUE_FLOAT);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x179,"%s","value_is_compatible(&v, VALUE_FLOAT)");
  iVar1 = value_is_compatible(&local_30,VALUE_DOUBLE);
  acutest_check_((uint)(iVar1 != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x17a,"%s","value_is_compatible(&v, VALUE_DOUBLE)");
  iVar1 = value_is_compatible(&local_30,VALUE_ARRAY);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x17b,"%s","!value_is_compatible(&v, VALUE_ARRAY)");
  iVar1 = value_is_compatible(&local_30,VALUE_DICT);
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x17c,"%s","!value_is_compatible(&v, VALUE_DICT)");
  uVar6 = value_uint64(&local_30);
  acutest_check_((uint)(uVar6 == 0xffffffffffffffff),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x17d,"%s","value_uint64(&v) == UINT64_MAX");
  fVar8 = value_float(&local_30);
  if (((1.8446744e+19 < fVar8 * 0.9999) || (fVar8 * 1.0001 < 1.8446744e+19)) &&
     (uVar7 = 0, fVar8 * 1.0001 <= 1.8446744e+19)) {
    uVar7 = (uint)(1.8446744e+19 <= fVar8 * 0.9999);
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x17e,"%s","FLOAT_EQ(value_float(&v), (float) UINT64_MAX)");
  dVar9 = value_double(&local_30);
  if (((1.8446744073709552e+19 < dVar9 * 0.9999999) ||
      (uVar7 = 1, dVar9 * 1.0000001 < 1.8446744073709552e+19)) &&
     (uVar7 = 0, dVar9 * 1.0000001 <= 1.8446744073709552e+19)) {
    uVar7 = (uint)(1.8446744073709552e+19 <= dVar9 * 0.9999999);
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-value.c"
                 ,0x17f,"%s","DOUBLE_EQ(value_double(&v), (double) UINT64_MAX)");
  value_fini(&local_30);
  return;
}

Assistant:

static void
test_uint64(void)
{
    VALUE v;

    TEST_CHECK(value_init_uint64(NULL, 0) != 0);

    value_init_uint64(&v, 0U);
    TEST_CHECK(value_type(&v) == VALUE_UINT64);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_int32(&v) == 0);
    TEST_CHECK(value_uint32(&v) == 0);
    TEST_CHECK(value_int64(&v) == 0);
    TEST_CHECK(value_uint64(&v) == 0);
    TEST_CHECK(FLOAT_EQ(value_float(&v), 0.0f));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), 0.0));
    value_fini(&v);

    value_init_uint64(&v, UINT64_MAX);
    TEST_CHECK(value_type(&v) == VALUE_UINT64);
    TEST_CHECK(!value_is_compatible(&v, VALUE_NULL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_BOOL));
    TEST_CHECK(!value_is_compatible(&v, VALUE_INT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_UINT32));
    TEST_CHECK(!value_is_compatible(&v, VALUE_INT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_UINT64));
    TEST_CHECK(value_is_compatible(&v, VALUE_FLOAT));
    TEST_CHECK(value_is_compatible(&v, VALUE_DOUBLE));
    TEST_CHECK(!value_is_compatible(&v, VALUE_ARRAY));
    TEST_CHECK(!value_is_compatible(&v, VALUE_DICT));
    TEST_CHECK(value_uint64(&v) == UINT64_MAX);
    TEST_CHECK(FLOAT_EQ(value_float(&v), (float) UINT64_MAX));
    TEST_CHECK(DOUBLE_EQ(value_double(&v), (double) UINT64_MAX));
    value_fini(&v);
}